

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.c
# Opt level: O0

void test_mixed_long_short(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *a;
  int v;
  int ac;
  char *av [7];
  int opti;
  
  av[6]._4_4_ = 1;
  a._4_4_ = 7;
  _result__1 = (char *)0x0;
  _v = "program";
  av[0] = "--value=123";
  av[1] = "-f";
  av[2] = "--longflag";
  av[3] = "-b";
  av[4] = "-vxyz";
  av[5] = "456";
  nVar1 = nng_args_parse(7,(char **)&v,case1,(int *)&a,(char **)&result__1,(int *)((long)av + 0x34))
  ;
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0xef,"%s: expected success, got %s (%d)",
                         "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(av[6]._4_4_ == 2),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xf0,"%s","opti == 2");
  acutest_check_((uint)((int)a == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xf1,"%s","v == 3");
  iVar2 = strcmp(_result__1,"123");
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xf2,"%s == %s",_result__1,"123",nVar1);
  nVar1 = nng_args_parse(a._4_4_,(char **)&v,case1,(int *)&a,(char **)&result__1,
                         (int *)((long)av + 0x34));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0xf3,"%s: expected success, got %s (%d)",
                         "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(av[6]._4_4_ == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xf4,"%s","opti == 3");
  acutest_check_((uint)((int)a == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xf5,"%s","v == 1");
  nVar1 = nng_args_parse(a._4_4_,(char **)&v,case1,(int *)&a,(char **)&result__1,
                         (int *)((long)av + 0x34));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0xf6,"%s: expected success, got %s (%d)",
                         "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(av[6]._4_4_ == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xf7,"%s","opti == 4");
  acutest_check_((uint)((int)a == 2),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xf8,"%s","v == 2");
  nVar1 = nng_args_parse(a._4_4_,(char **)&v,case1,(int *)&a,(char **)&result__1,
                         (int *)((long)av + 0x34));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0xf9,"%s: expected success, got %s (%d)",
                         "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(av[6]._4_4_ == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xfa,"%s","opti == 5");
  acutest_check_((uint)((int)a == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xfb,"%s","v == 4");
  nVar1 = nng_args_parse(a._4_4_,(char **)&v,case1,(int *)&a,(char **)&result__1,
                         (int *)((long)av + 0x34));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0xfc,"%s: expected success, got %s (%d)",
                         "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(av[6]._4_4_ == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xfd,"%s","opti == 6");
  acutest_check_((uint)((int)a == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xfe,"%s","v == 3");
  iVar2 = strcmp(_result__1,"xyz");
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xff,"%s == %s",_result__1,"xyz",nVar1);
  iVar2 = strcmp(*(char **)(&v + (long)av[6]._4_4_ * 2),"456");
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x100,"%s == %s",*(undefined8 *)(&v + (long)av[6]._4_4_ * 2),"456");
  iVar2 = nng_args_parse(a._4_4_,(char **)&v,case1,(int *)&a,(char **)&result__1,
                         (int *)((long)av + 0x34));
  acutest_check_((uint)(iVar2 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x101,"%s","nng_args_parse(ac, av, case1, &v, &a, &opti) == -1");
  acutest_check_((uint)(av[6]._4_4_ == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x102,"%s","opti == 6");
  return;
}

Assistant:

void
test_mixed_long_short(void)
{
	int   opti = 1;
	char *av[7];
	int   ac = 7;
	int   v;
	char *a = NULL;

	av[0] = "program";
	av[1] = "--value=123";
	av[2] = "-f";
	av[3] = "--longflag";
	av[4] = "-b";
	av[5] = "-vxyz";
	av[6] = "456";
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 2);
	NUTS_TRUE(v == 3);
	NUTS_MATCH(a, "123");
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 3);
	NUTS_TRUE(v == 1);
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 4);
	NUTS_TRUE(v == 2);
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 5);
	NUTS_TRUE(v == 4);
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 6);
	NUTS_TRUE(v == 3);
	NUTS_MATCH(a, "xyz");
	NUTS_MATCH(av[opti], "456");
	NUTS_TRUE(nng_args_parse(ac, av, case1, &v, &a, &opti) == -1);
	NUTS_TRUE(opti == 6);
}